

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution-graph.hxx
# Opt level: O2

void __thiscall lineage::SolutionGraph::saveSVG(SolutionGraph *this,string *fileName)

{
  ProblemGraph *pPVar1;
  pointer pvVar2;
  pointer puVar3;
  long lVar4;
  pointer pVVar5;
  ostream *poVar6;
  unsigned_long *node;
  pointer puVar7;
  VertexIterator it;
  pointer pAVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  vector<CellLine,_std::allocator<CellLine>_> cellLines;
  ulong local_238;
  ofstream file;
  long local_220;
  long local_200;
  long local_1f8;
  long local_1e8;
  
  std::vector<CellLine,_std::allocator<CellLine>_>::vector
            (&cellLines,
             (long)(this->lineageGraph_).vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->lineageGraph_).vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&file);
  std::stack<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  stack<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &file);
  local_238 = 0;
  while( true ) {
    pVVar5 = (this->lineageGraph_).vertices_.
             super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->lineageGraph_).vertices_.
                      super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 6) <= local_238)
    break;
    if (*(pointer *)((long)&pVVar5[local_238].from_.vector_ + 8) ==
        *(pointer *)&pVVar5[local_238].from_.vector_) {
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&file,&local_238);
    }
    local_238 = local_238 + 1;
  }
  sVar11 = 0;
  while (local_200 != local_220) {
    lVar4 = local_200;
    if (local_200 == local_1f8) {
      lVar4 = *(long *)(local_1e8 + -8) + 0x200;
    }
    lVar4 = *(long *)(lVar4 + -8);
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&file);
    cellLines.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
    super__Vector_impl_data._M_start[lVar4].x = sVar11;
    cellLines.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
    super__Vector_impl_data._M_start[lVar4].tMin = 0xffffffffffffffff;
    cellLines.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
    super__Vector_impl_data._M_start[lVar4].tMax = 1;
    pPVar1 = this->problemGraph_;
    pvVar2 = (this->nodesOfCell_).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = *(pointer *)
              ((long)&pvVar2[lVar4].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data + 8);
    uVar9 = 1;
    uVar12 = 0xffffffffffffffff;
    for (puVar7 = pvVar2[lVar4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar3; puVar7 = puVar7 + 1) {
      uVar10 = (ulong)*(int *)((long)(pPVar1->problem_->nodes).
                                     super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
                                     ._M_impl.super__Vector_impl_data._M_start + *puVar7 * 0x18);
      if (uVar10 < uVar12) {
        cellLines.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4].tMin = uVar10;
        uVar12 = uVar10;
      }
      if (uVar9 < uVar10) {
        cellLines.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4].tMax = uVar10;
        uVar9 = uVar10;
      }
    }
    pVVar5 = (this->lineageGraph_).vertices_.
             super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar8 = *(pointer *)
              &pVVar5[lVar4].to_.vector_.
               super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
    ;
    if (*(pointer *)((long)&pVVar5[lVar4].to_.vector_ + 8) == pAVar8) {
      sVar11 = sVar11 + 1;
    }
    else {
      for (; pAVar8 != *(pointer *)((long)&pVVar5[lVar4].to_.vector_ + 8); pAVar8 = pAVar8 + 1) {
        local_238 = pAVar8->vertex_;
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&file,&local_238);
        pVVar5 = (this->lineageGraph_).vertices_.
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
            ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&file);
  std::ofstream::ofstream(&file,(string *)fileName,_S_out);
  poVar6 = std::operator<<((ostream *)&file,
                           "<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"no\"?>");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,"<!DOCTYPE svg PUBLIC \"-//W3C//DTD SVG 1.1//EN\" ");
  poVar6 = std::operator<<(poVar6,"\"http://www.w3.org/Graphics/SVG/1.1/DTD/svg11.dtd\">");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,"<svg version=\"1.1\" xmlns=\"http://www.w3.org/2000/svg\" ");
  poVar6 = std::operator<<(poVar6,"xmlns:xlink=\"http://www.w3.org/1999/xlink\"");
  poVar6 = std::operator<<(poVar6,">");
  std::endl<char,std::char_traits<char>>(poVar6);
  uVar9 = 0;
  while( true ) {
    if ((ulong)(((long)cellLines.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)cellLines.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18) <= uVar9) break;
    poVar6 = std::operator<<((ostream *)&file,"<line x1=\"");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"\"");
    poVar6 = std::operator<<(poVar6," y1=\"");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"\"");
    poVar6 = std::operator<<(poVar6," x2=\"");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"\"");
    poVar6 = std::operator<<(poVar6," y2=\"");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"\"");
    poVar6 = std::operator<<(poVar6," style=\"stroke:rgb(0, 0, 0); stroke-width:1pt;\"/>");
    std::endl<char,std::char_traits<char>>(poVar6);
    for (uVar12 = cellLines.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9].tMin;
        uVar12 <= cellLines.super__Vector_base<CellLine,_std::allocator<CellLine>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9].tMax; uVar12 = uVar12 + 1) {
      std::operator<<((ostream *)&file,"<line x1=\"");
      poVar6 = std::ostream::_M_insert<double>
                         ((((double)CONCAT44(0x45300000,
                                             (int)(cellLines.
                                                                                                      
                                                  super__Vector_base<CellLine,_std::allocator<CellLine>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar9].x
                                                  >> 0x20)) - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,
                                             (int)cellLines.
                                                  super__Vector_base<CellLine,_std::allocator<CellLine>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar9].x
                                            ) - 4503599627370496.0) + -0.2) * 10.0);
      poVar6 = std::operator<<(poVar6,"\"");
      poVar6 = std::operator<<(poVar6," y1=\"");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6,"\"");
      std::operator<<(poVar6," x2=\"");
      poVar6 = std::ostream::_M_insert<double>
                         ((((double)CONCAT44(0x45300000,
                                             (int)(cellLines.
                                                                                                      
                                                  super__Vector_base<CellLine,_std::allocator<CellLine>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar9].x
                                                  >> 0x20)) - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,
                                             (int)cellLines.
                                                  super__Vector_base<CellLine,_std::allocator<CellLine>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar9].x
                                            ) - 4503599627370496.0) + 0.2) * 10.0);
      poVar6 = std::operator<<(poVar6,"\"");
      poVar6 = std::operator<<(poVar6," y2=\"");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6,"\"");
      poVar6 = std::operator<<(poVar6," style=\"stroke:rgb(0, 0, 0); stroke-width:1pt;\"/>");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    uVar9 = uVar9 + 1;
  }
  for (uVar9 = 0;
      uVar9 < (ulong)((long)(this->lineageGraph_).edges_.
                            super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->lineageGraph_).edges_.
                            super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar9 = uVar9 + 1) {
    poVar6 = std::operator<<((ostream *)&file,"<line x1=\"");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"\"");
    poVar6 = std::operator<<(poVar6," y1=\"");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"\"");
    poVar6 = std::operator<<(poVar6," x2=\"");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"\"");
    poVar6 = std::operator<<(poVar6," y2=\"");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"\"");
    poVar6 = std::operator<<(poVar6," style=\"stroke:rgb(0, 153, 0); stroke-width:1pt;\"/>");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::operator<<((ostream *)&file,"</svg>\n");
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  std::_Vector_base<CellLine,_std::allocator<CellLine>_>::~_Vector_base
            (&cellLines.super__Vector_base<CellLine,_std::allocator<CellLine>_>);
  return;
}

Assistant:

void saveSVG(std::string const& fileName = "lineage") const
    {
        struct CellLine
        {
            size_t x;
            size_t tMin;
            size_t tMax;
        };

        std::vector<CellLine> cellLines(lineageGraph_.numberOfVertices());

        {
            std::stack<size_t> cells;

            // put all roots on the stack
            for (size_t v = 0; v < lineageGraph_.numberOfVertices(); ++v)
                if (lineageGraph_.numberOfEdgesToVertex(v) == 0)
                    cells.push(v);

            size_t xOffset = 0;
            while (!cells.empty())
            {
                auto cell = cells.top();
                cells.pop();

                cellLines[cell].x = xOffset;
                cellLines[cell].tMin = std::numeric_limits<size_t>::max();
                cellLines[cell].tMax = -std::numeric_limits<size_t>::max();

                for (auto& node : nodesOfCell_[cell])
                {
                    auto tNode = problem().nodes[node].t;
                    if (tNode < cellLines[cell].tMin)
                        cellLines[cell].tMin = tNode;
                    
                    if (tNode > cellLines[cell].tMax)
                        cellLines[cell].tMax = tNode;
                }

                if (lineageGraph_.numberOfEdgesFromVertex(cell) == 0) // if leaf
                    ++xOffset;
                else 
                    for(auto it = lineageGraph_.verticesFromVertexBegin(cell); it != lineageGraph_.verticesFromVertexEnd(cell); ++it)
                        cells.push(*it);
            }
        }

        std::ofstream file(fileName);

        // print header
        file << "<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"no\"?>"
            << std::endl
            << "<!DOCTYPE svg PUBLIC \"-//W3C//DTD SVG 1.1//EN\" "
            << "\"http://www.w3.org/Graphics/SVG/1.1/DTD/svg11.dtd\">"
            << std::endl
            << "<svg version=\"1.1\" xmlns=\"http://www.w3.org/2000/svg\" "
            << "xmlns:xlink=\"http://www.w3.org/1999/xlink\""
            // << " width=" << ???
            // << " height=" << ???
            << ">"
            << std::endl;

        size_t xScale = 10;
        size_t yScale = 5;
        for (size_t j = 0; j < cellLines.size(); ++j)
        {
            // draw line from (xOffset, tMin) to (xOffset, tMax)
            file << "<line x1=\"" << cellLines[j].x * xScale << "\""
                << " y1=\"" << cellLines[j].tMin * yScale<< "\""
                << " x2=\"" << cellLines[j].x * xScale << "\""
                << " y2=\"" << cellLines[j].tMax * yScale << "\""
                << " style=\"stroke:rgb(0, 0, 0); stroke-width:1pt;\"/>"
                << std::endl;

            for (size_t t = cellLines[j].tMin; t <= cellLines[j].tMax; ++t)
                file << "<line x1=\"" << (cellLines[j].x - 0.2) * xScale << "\""
                    << " y1=\"" << t * yScale<< "\""
                    << " x2=\"" << (cellLines[j].x + 0.2) * xScale << "\""
                    << " y2=\"" << t * yScale << "\""
                    << " style=\"stroke:rgb(0, 0, 0); stroke-width:1pt;\"/>"
                    << std::endl;
        }

        for (size_t e = 0; e < lineageGraph_.numberOfEdges(); ++e)
        {
            auto cell0 = lineageGraph_.vertexOfEdge(e, 0);
            auto cell1 = lineageGraph_.vertexOfEdge(e, 1);

            file << "<line x1=\"" << cellLines[cell0].x * xScale << "\""
                << " y1=\"" << cellLines[cell0].tMax * yScale<< "\""
                << " x2=\"" << cellLines[cell1].x * xScale << "\""
                << " y2=\"" << cellLines[cell1].tMin * yScale << "\""
                << " style=\"stroke:rgb(0, 153, 0); stroke-width:1pt;\"/>"
                << std::endl;
        }

        // print footer
        file << "</svg>\n";

        file.close();
    }